

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_add16(TCGContext_conflict1 *tcg_ctx,TCGv_i32 dest,TCGv_i32 t0,TCGv_i32 t1)

{
  TCGv_i32 ret;
  TCGv_i32 tmp;
  TCGv_i32 t1_local;
  TCGv_i32 t0_local;
  TCGv_i32 dest_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  ret = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_xor_i32(tcg_ctx,ret,t0,t1);
  tcg_gen_andi_i32_aarch64(tcg_ctx,ret,ret,0x8000);
  tcg_gen_andi_i32_aarch64(tcg_ctx,t0,t0,-0x8001);
  tcg_gen_andi_i32_aarch64(tcg_ctx,t1,t1,-0x8001);
  tcg_gen_add_i32(tcg_ctx,t0,t0,t1);
  tcg_gen_xor_i32(tcg_ctx,dest,t0,ret);
  tcg_temp_free_i32(tcg_ctx,ret);
  return;
}

Assistant:

static void gen_add16(TCGContext *tcg_ctx, TCGv_i32 dest, TCGv_i32 t0, TCGv_i32 t1)
{
    TCGv_i32 tmp = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_xor_i32(tcg_ctx, tmp, t0, t1);
    tcg_gen_andi_i32(tcg_ctx, tmp, tmp, 0x8000);
    tcg_gen_andi_i32(tcg_ctx, t0, t0, ~0x8000);
    tcg_gen_andi_i32(tcg_ctx, t1, t1, ~0x8000);
    tcg_gen_add_i32(tcg_ctx, t0, t0, t1);
    tcg_gen_xor_i32(tcg_ctx, dest, t0, tmp);
    tcg_temp_free_i32(tcg_ctx, tmp);
}